

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.cpp
# Opt level: O2

char * duckdb::Terminal::EditNoTTY(void)

{
  int iVar1;
  char *pcVar2;
  size_t __size;
  char *__ptr;
  size_t sVar3;
  char *unaff_R14;
  
  sVar3 = 0;
  __size = 0;
  __ptr = (char *)0x0;
  do {
    pcVar2 = __ptr;
    if (sVar3 == __size) {
      __size = sVar3 * 2;
      if (sVar3 == 0) {
        __size = 0x20;
      }
      pcVar2 = (char *)realloc(__ptr,__size);
      if (pcVar2 == (char *)0x0) goto LAB_001f3303;
    }
    __ptr = pcVar2;
    iVar1 = fgetc(_stdin);
    if ((iVar1 == 10) || (iVar1 == -1)) {
      if (sVar3 == 0 && iVar1 == -1) {
LAB_001f3303:
        free(__ptr);
        return (char *)0x0;
      }
      __ptr[sVar3] = '\0';
      unaff_R14 = __ptr;
    }
    else {
      __ptr[sVar3] = (char)iVar1;
      sVar3 = sVar3 + 1;
    }
    if (iVar1 == -1) {
      return unaff_R14;
    }
    if (iVar1 == 10) {
      return unaff_R14;
    }
  } while( true );
}

Assistant:

char *Terminal::EditNoTTY() {
	char *line = NULL;
	size_t len = 0, maxlen = 0;

	while (1) {
		if (len == maxlen) {
			if (maxlen == 0)
				maxlen = 16;
			maxlen *= 2;
			char *oldval = line;
			line = (char *)realloc(line, maxlen);
			if (line == NULL) {
				if (oldval)
					free(oldval);
				return NULL;
			}
		}
		int c = fgetc(stdin);
		if (c == EOF || c == '\n') {
			if (c == EOF && len == 0) {
				free(line);
				return NULL;
			} else {
				line[len] = '\0';
				return line;
			}
		} else {
			line[len] = c;
			len++;
		}
	}
}